

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

void zdd_refs_mark_task_CALL(WorkerP *w,Task *__dq_head)

{
  long *in_FS_OFFSET;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  zdd_refs_mark_p_par_SPAWN
            (w,__dq_head,(ZDD **)**(undefined8 **)(*in_FS_OFFSET + -0x10),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x10) + 0x10) - **(long **)(*in_FS_OFFSET + -0x10)
             >> 3);
  zdd_refs_mark_r_par_SPAWN
            (w,__dq_head + 1,*(ZDD **)(*(long *)(*in_FS_OFFSET + -0x10) + 0x18),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x10) + 0x28) -
             *(long *)(*(long *)(*in_FS_OFFSET + -0x10) + 0x18) >> 3);
  zdd_refs_mark_s_par_CALL
            (w,__dq_head + 2,*(zdd_refs_task_t *)(*(long *)(*in_FS_OFFSET + -0x10) + 0x30),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x10) + 0x40) -
             *(long *)(*(long *)(*in_FS_OFFSET + -0x10) + 0x30) >> 4);
  zdd_refs_mark_r_par_SYNC(w,__dq_head + 1);
  zdd_refs_mark_p_par_SYNC(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(zdd_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(zdd_refs_key, zdd_refs_internal_t);
    SPAWN(zdd_refs_mark_p_par, zdd_refs_key->pbegin, zdd_refs_key->pcur-zdd_refs_key->pbegin);
    SPAWN(zdd_refs_mark_r_par, zdd_refs_key->rbegin, zdd_refs_key->rcur-zdd_refs_key->rbegin);
    CALL(zdd_refs_mark_s_par, zdd_refs_key->sbegin, zdd_refs_key->scur-zdd_refs_key->sbegin);
    SYNC(zdd_refs_mark_r_par);
    SYNC(zdd_refs_mark_p_par);
}